

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x20,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0xc4);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0035b718;
  return this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakOutsideCheckingPeriod)
{
    detector->stopChecking();
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    SimpleString output = detector->report(mem_leak_period_all);
    CHECK(output.contains("Memory leak(s) found"));
    CHECK(output.contains("size: 4"));
    CHECK(output.contains("new"));
    CHECK(output.contains("Total number of leaks"));
    PlatformSpecificFree(mem);
}